

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *this,
          size_t newSize)

{
  MemberInfo **ppMVar1;
  MemberInfo **ppMVar2;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar3;
  ulong __n;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> local_38;
  
  ppMVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppMVar1 >> 3)) {
    (this->builder).pos = ppMVar1 + newSize;
  }
  local_38.pos = (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.pos + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  ppMVar1 = (this->builder).ptr;
  ppMVar2 = (this->builder).pos;
  local_38.ptr = local_38.pos;
  if (ppMVar1 != ppMVar2) {
    __n = (long)ppMVar2 - (long)ppMVar1 & 0xfffffffffffffff8;
    memcpy(local_38.pos,ppMVar1,__n);
    local_38.pos = (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)
                   ((long)local_38.pos + __n);
  }
  ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::operator=
            (&this->builder,&local_38);
  ppMVar2 = local_38.endPtr;
  ppMVar3 = local_38.pos;
  ppMVar1 = local_38.ptr;
  if (local_38.ptr != (MemberInfo **)0x0) {
    local_38.ptr = (MemberInfo **)0x0;
    local_38.pos = (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)
                   0x0;
    local_38.endPtr = (MemberInfo **)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,ppMVar1,8,(long)ppMVar3 - (long)ppMVar1 >> 3,
               (long)ppMVar2 - (long)ppMVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }